

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex7.cpp
# Opt level: O3

char * cat_dot(char *s1,char *s2,char *delim)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  char *pcVar8;
  
  lVar7 = 1;
  if ((s1 != (char *)0x0) && (*s1 != '\0')) {
    lVar7 = 1;
    do {
      pcVar5 = s1 + lVar7;
      lVar7 = lVar7 + 1;
    } while (*pcVar5 != '\0');
  }
  lVar2 = 0;
  lVar4 = 0;
  if ((s2 != (char *)0x0) && (lVar4 = 0, *s2 != '\0')) {
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (s2[lVar1] != '\0');
  }
  if ((delim != (char *)0x0) && (*delim != '\0')) {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (delim[lVar1] != '\0');
  }
  pcVar3 = (char *)operator_new__((ulong)(uint)((int)lVar7 + (int)lVar4 + (int)lVar2));
  pcVar5 = pcVar3;
  if ((s1 != (char *)0x0) && (cVar6 = *s1, cVar6 != '\0')) {
    pcVar8 = s1 + 1;
    do {
      *pcVar5 = cVar6;
      pcVar5 = pcVar5 + 1;
      cVar6 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar6 != '\0');
  }
  if (delim != (char *)0x0) {
    cVar6 = *delim;
    while (cVar6 != '\0') {
      delim = delim + 1;
      *pcVar5 = cVar6;
      pcVar5 = pcVar5 + 1;
      cVar6 = *delim;
    }
  }
  if ((s2 != (char *)0x0) && (cVar6 = *s2, cVar6 != '\0')) {
    pcVar8 = s2 + 1;
    do {
      *pcVar5 = cVar6;
      pcVar5 = pcVar5 + 1;
      cVar6 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar6 != '\0');
  }
  *pcVar5 = '\0';
  return pcVar3;
}

Assistant:

char* cat_dot(const char* s1, const char* s2, const char* delim)
{
	uint32_t size = str_len(s1) + str_len(s2) + str_len(delim) + 1;
	char* str = new char[size];
	char* begin = str;
	uint32_t cnt = 0;
	while (s1 && *s1)
	{
		*str++ = *s1++;
	}

	while (delim && *delim)
	{
		*str++ = *delim++;
	}

	while (s2 && *s2)
	{
		*str++ = *s2++;
	}
	*str = '\0';
	return begin;
}